

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall QtMWidgets::TableViewCell::paintEvent(TableViewCell *this,QPaintEvent *e)

{
  TableViewCellPrivate *pTVar1;
  QRect local_58;
  QRect local_48;
  QBrush local_38 [24];
  QPainter local_20 [8];
  QPainter p;
  QPaintEvent *e_local;
  TableViewCell *this_local;
  
  _p = e;
  QWidget::paintEvent((QPaintEvent *)this);
  pTVar1 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
           ::operator->(&this->d);
  if ((pTVar1->clicked & 1U) != 0) {
    pTVar1 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
             ::operator->(&this->d);
    if ((pTVar1->highlightOnClick & 1U) != 0) {
      QPainter::QPainter(local_20,(QPaintDevice *)&this->field_0x10);
      QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
      ::operator->(&this->d);
      QPainter::setPen((QColor *)local_20);
      pTVar1 = QScopedPointer<QtMWidgets::TableViewCellPrivate,_QScopedPointerDeleter<QtMWidgets::TableViewCellPrivate>_>
               ::operator->(&this->d);
      QBrush::QBrush(local_38,(QColor *)&pTVar1->highlightColor,SolidPattern);
      QPainter::setBrush((QBrush *)local_20);
      QBrush::~QBrush(local_38);
      local_58 = QWidget::rect(&this->super_QWidget);
      local_48 = QRect::adjusted(&local_58,0,0,-1,-1);
      QPainter::drawRect(local_20,&local_48);
      QPainter::~QPainter(local_20);
    }
  }
  return;
}

Assistant:

void
TableViewCell::paintEvent( QPaintEvent * e )
{
	QWidget::paintEvent( e );

	if( d->clicked && d->highlightOnClick )
	{
		QPainter p( this );

		p.setPen( d->highlightColor );
		p.setBrush( d->highlightColor );

		p.drawRect( rect().adjusted( 0, 0, -1, -1 ) );
	}
}